

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodyOwnMass.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesBodyOwnMass::MultiplyAndAdd
          (ChVariablesBodyOwnMass *this,ChVectorRef *result,ChVectorConstRef vect,double c_a)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  long lVar15;
  PointerType pdVar16;
  long lVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  undefined8 in_XMM0_Qb;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  uVar14 = (this->super_ChVariablesBody).super_ChVariables.offset;
  lVar26 = (long)(int)uVar14;
  if ((-1 < lVar26) &&
     (lVar15 = (vect->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_rows.m_value, lVar26 < lVar15)) {
    uVar24 = (ulong)uVar14;
    if ((((long)(uVar24 + 1) < lVar15) &&
        ((((long)(uVar24 + 2) < lVar15 && (uVar25 = (ulong)(uVar14 + 3), (long)uVar25 < lVar15)) &&
         (uVar23 = (ulong)(uVar14 + 4), (long)uVar23 < lVar15)))) &&
       (uVar22 = (ulong)(uVar14 + 5), (long)uVar22 < lVar15)) {
      lVar15 = *(long *)&(result->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                         ).field_0x8;
      if (lVar26 < lVar15) {
        pdVar16 = (vect->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_data;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = pdVar16[lVar26];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = pdVar16[uVar24 + 1];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = pdVar16[uVar24 + 2];
        auVar28._8_8_ = 0;
        auVar28._0_8_ = pdVar16[uVar25];
        dVar1 = pdVar16[uVar23];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pdVar16[uVar22];
        dVar18 = c_a * this->mass;
        lVar17 = *(long *)&result->
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(lVar17 + lVar26 * 8);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar18;
        auVar2 = vfmadd213sd_fma(auVar36,auVar33,auVar2);
        *(long *)(lVar17 + lVar26 * 8) = auVar2._0_8_;
        if ((long)(uVar24 + 1) < lVar15) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(lVar17 + 8 + uVar24 * 8);
          auVar2 = vfmadd213sd_fma(auVar35,auVar33,auVar3);
          *(long *)(lVar17 + 8 + uVar24 * 8) = auVar2._0_8_;
          if ((long)(uVar24 + 2) < lVar15) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(lVar17 + 0x10 + uVar24 * 8);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = dVar18;
            auVar2 = vfmadd213sd_fma(auVar30,auVar34,auVar4);
            *(long *)(lVar17 + 0x10 + uVar24 * 8) = auVar2._0_8_;
            if ((long)uVar25 < lVar15) {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0];
              auVar31._8_8_ = 0;
              auVar31._0_8_ =
                   dVar1 * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[1];
              auVar2 = vfmadd231sd_fma(auVar31,auVar28,auVar5);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2];
              auVar2 = vfmadd231sd_fma(auVar2,auVar27,auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)(lVar17 + uVar25 * 8);
              auVar19._8_8_ = in_XMM0_Qb;
              auVar19._0_8_ = c_a;
              auVar2 = vfmadd213sd_fma(auVar2,auVar19,auVar7);
              *(long *)(lVar17 + uVar25 * 8) = auVar2._0_8_;
              if ((long)uVar23 < lVar15) {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[3];
                auVar32._8_8_ = 0;
                auVar32._0_8_ =
                     dVar1 * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[4];
                auVar2 = vfmadd231sd_fma(auVar32,auVar28,auVar8);
                auVar9._8_8_ = 0;
                auVar9._0_8_ = (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[5];
                auVar2 = vfmadd231sd_fma(auVar2,auVar27,auVar9);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)(lVar17 + uVar23 * 8);
                auVar20._8_8_ = in_XMM0_Qb;
                auVar20._0_8_ = c_a;
                auVar2 = vfmadd213sd_fma(auVar2,auVar20,auVar10);
                *(long *)(lVar17 + uVar23 * 8) = auVar2._0_8_;
                if ((long)uVar22 < lVar15) {
                  auVar11._8_8_ = 0;
                  auVar11._0_8_ =
                       (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6];
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ =
                       dVar1 * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[7];
                  auVar2 = vfmadd132sd_fma(auVar28,auVar29,auVar11);
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ =
                       (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8];
                  auVar2 = vfmadd132sd_fma(auVar27,auVar2,auVar12);
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = *(ulong *)(lVar17 + uVar22 * 8);
                  auVar21._8_8_ = in_XMM0_Qb;
                  auVar21._0_8_ = c_a;
                  auVar2 = vfmadd213sd_fma(auVar2,auVar21,auVar13);
                  *(long *)(lVar17 + uVar22 * 8) = auVar2._0_8_;
                  return;
                }
              }
            }
          }
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                   );
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChVariablesBodyOwnMass::MultiplyAndAdd(ChVectorRef result, ChVectorConstRef vect, const double c_a) const {
    // optimized unrolled operations
    double q0 = vect(this->offset + 0);
    double q1 = vect(this->offset + 1);
    double q2 = vect(this->offset + 2);
    double q3 = vect(this->offset + 3);
    double q4 = vect(this->offset + 4);
    double q5 = vect(this->offset + 5);
    double scaledmass = c_a * mass;
    result(this->offset + 0) += scaledmass * q0;
    result(this->offset + 1) += scaledmass * q1;
    result(this->offset + 2) += scaledmass * q2;
    result(this->offset + 3) += c_a * (inertia(0, 0) * q3 + inertia(0, 1) * q4 + inertia(0, 2) * q5);
    result(this->offset + 4) += c_a * (inertia(1, 0) * q3 + inertia(1, 1) * q4 + inertia(1, 2) * q5);
    result(this->offset + 5) += c_a * (inertia(2, 0) * q3 + inertia(2, 1) * q4 + inertia(2, 2) * q5);
}